

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_validate_value(char *expected,char *subj,size_t subj_len,int case_insensitive)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char *local_18;
  char *local_10;
  
  sVar3 = strlen(in_RDI);
  if (sVar3 == in_RDX) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (in_ECX != 0) {
      while( true ) {
        bVar4 = false;
        if (*local_10 != '\0') {
          bVar4 = *local_18 != '\0';
        }
        if (!bVar4) break;
        iVar1 = tolower((int)*local_10);
        iVar2 = tolower((int)*local_18);
        if (iVar1 != iVar2) {
          return 0;
        }
        local_10 = local_10 + 1;
        local_18 = local_18 + 1;
      }
      return 1;
    }
    while( true ) {
      bVar4 = false;
      if (*local_10 != '\0') {
        bVar4 = *local_18 != '\0';
      }
      if (!bVar4) {
        return 1;
      }
      if (*local_10 != *local_18) break;
      local_10 = local_10 + 1;
      local_18 = local_18 + 1;
    }
  }
  return 0;
}

Assistant:

static int nn_ws_validate_value (const char* expected, const char *subj,
    size_t subj_len, int case_insensitive)
{
    if (strlen (expected) != subj_len)
        return NN_WS_HANDSHAKE_NOMATCH;

    if (case_insensitive) {
        while (*expected && *subj) {
            if (tolower (*expected) != tolower (*subj))
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }
    else {
        while (*expected && *subj) {
            if (*expected != *subj)
                return NN_WS_HANDSHAKE_NOMATCH;
            expected++;
            subj++;
        }
    }

    return NN_WS_HANDSHAKE_MATCH;
}